

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  cmLocalGenerator *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  string *psVar5;
  cmGlobalGenerator *pcVar6;
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [32];
  string local_1f8;
  undefined4 local_1d4;
  string local_1d0;
  string local_1b0;
  string local_190;
  cmValue local_170;
  cmValue outdir;
  string local_148;
  string local_128;
  cmValue local_108;
  cmValue config_outdir;
  undefined1 local_e0 [8];
  string configProp;
  string configUpper;
  string conf;
  string local_70;
  undefined1 local_50 [8];
  string propertyName;
  string *out_local;
  string *config_local;
  string *kind_local;
  cmGeneratorTarget *this_local;
  
  propertyName.field_2._8_8_ = out;
  std::__cxx11::string::string((string *)local_50);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[18]>(&local_70,kind,(char (*) [18])0xfe9390);
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::string((string *)(configUpper.field_2._M_local_buf + 8),(string *)config);
  cmsys::SystemTools::UpperCase
            ((string *)((long)&configProp.field_2 + 8),(string *)((long)&configUpper.field_2 + 8));
  std::__cxx11::string::string((string *)local_e0);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[19],std::__cxx11::string&>
              ((string *)&config_outdir,kind,(char (*) [19])0xff8a89,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&configProp.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_e0,(string *)&config_outdir);
    std::__cxx11::string::~string((string *)&config_outdir);
  }
  local_108 = GetProperty(this,(string *)local_e0);
  bVar3 = cmValue::operator_cast_to_bool(&local_108);
  if (bVar3) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_108);
    std::__cxx11::string::string((string *)&local_148,(string *)psVar5);
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&outdir);
    cmGeneratorExpression::Evaluate
              (&local_128,&local_148,pcVar1,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)&outdir);
    std::__cxx11::string::operator=((string *)propertyName.field_2._8_8_,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&outdir);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::clear();
  }
  else {
    local_170 = GetProperty(this,(string *)local_50);
    bVar3 = cmValue::operator_cast_to_bool(&local_170);
    if (bVar3) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_170);
      std::__cxx11::string::string((string *)&local_1b0,(string *)psVar5);
      pcVar1 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_1d0);
      cmGeneratorExpression::Evaluate
                (&local_190,&local_1b0,pcVar1,config,(cmGeneratorTarget *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_1d0);
      std::__cxx11::string::operator=((string *)propertyName.field_2._8_8_,(string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1b0);
      uVar2 = propertyName.field_2._8_8_;
      psVar5 = cmValue::operator*[abi_cxx11_(&local_170);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              uVar2,psVar5);
      if (bVar3) {
        std::__cxx11::string::clear();
      }
    }
  }
  uVar4 = std::__cxx11::string::empty();
  uVar2 = propertyName.field_2._8_8_;
  if ((uVar4 & 1) == 0) {
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath(&local_1f8,(string *)uVar2,psVar5);
    std::__cxx11::string::operator=((string *)propertyName.field_2._8_8_,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pcVar6 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_218,"/",&local_219);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_240,"",&local_241);
      (*pcVar6->_vptr_cmGlobalGenerator[0x1a])
                (pcVar6,local_218,(undefined1 *)((long)&configUpper.field_2 + 8),local_240,
                 propertyName.field_2._8_8_);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator(&local_241);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator(&local_219);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  local_1d4 = 1;
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)(configProp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(configUpper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                            const std::string& config,
                                            std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  std::string propertyName;
  if (!kind.empty()) {
    propertyName = cmStrCat(kind, "_OUTPUT_DIRECTORY");
  }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  std::string configProp;
  if (!kind.empty()) {
    configProp = cmStrCat(kind, "_OUTPUT_DIRECTORY_", configUpper);
  }

  // Select an output directory.
  if (cmValue config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = cmGeneratorExpression::Evaluate(*config_outdir, this->LocalGenerator,
                                          config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (cmValue outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out =
      cmGeneratorExpression::Evaluate(*outdir, this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != *outdir) {
      conf.clear();
    }
  }
  if (out.empty()) {
    return false;
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, "", out);
  }
  return true;
}